

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,ArgMinMaxState<duckdb::string_t,_int> *state,
          string_t x_data,int y_data,AggregateBinaryInput *binary)

{
  long lVar1;
  ulong uVar2;
  undefined4 in_register_00000084;
  ArgMinMaxBase<duckdb::LessThan,false> AVar3;
  string_t new_value;
  
  uVar2 = x_data.value._8_8_;
  new_value.value._0_8_ = x_data.value._0_8_;
  lVar1 = **(long **)(CONCAT44(in_register_00000084,y_data) + 0x10);
  if ((lVar1 != 0) &&
     (uVar2 = *(ulong *)(CONCAT44(in_register_00000084,y_data) + 0x20),
     (*(ulong *)(lVar1 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0)) {
    return;
  }
  if (*(int *)(this + 0x18) <= x_data.value._8_4_) {
    return;
  }
  lVar1 = **(long **)(CONCAT44(in_register_00000084,y_data) + 8);
  if (lVar1 == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    uVar2 = *(ulong *)(CONCAT44(in_register_00000084,y_data) + 0x18);
    AVar3 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(lVar1 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) == 0);
    this[1] = AVar3;
    if ((bool)AVar3) goto LAB_00db5f92;
  }
  new_value.value.pointer.ptr = (char *)uVar2;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),(string_t *)state,new_value);
LAB_00db5f92:
  *(int *)(this + 0x18) = x_data.value._8_4_;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}